

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

char * anm_make_unique_filename(char *name,char *anmname,int num)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  pcVar1 = util_shortname(name);
  pcVar1 = strrchr(pcVar1,0x2e);
  if (pcVar1 == (char *)0x0) {
    sVar2 = strlen(name);
    pcVar1 = name + sVar2;
  }
  uVar6 = (long)pcVar1 - (long)name;
  pcVar1 = util_shortname(anmname);
  pcVar3 = strrchr(pcVar1,0x2e);
  iVar4 = (int)pcVar3;
  if (pcVar3 == (char *)0x0) {
    sVar2 = strlen(pcVar1);
    iVar4 = (int)pcVar1 + (int)sVar2;
  }
  uVar5 = iVar4 - (int)pcVar1;
  iVar4 = snprintf((char *)0x0,0,"%.*s@%.*s@%d%s",uVar6 & 0xffffffff,name,(ulong)uVar5,pcVar1,
                   (ulong)(uint)num,name + (int)uVar6);
  if (iVar4 != -1) {
    pcVar3 = (char *)malloc((long)(iVar4 + 1));
    if (pcVar3 != (char *)0x0) {
      snprintf(pcVar3,(long)(iVar4 + 1),"%.*s@%.*s@%d%s",uVar6 & 0xffffffff,name,(ulong)uVar5,pcVar1
               ,(ulong)(uint)num,name + (int)uVar6);
      return pcVar3;
    }
  }
  abort();
}

Assistant:

static char *
anm_make_unique_filename(
    const char *name,
    const char *anmname,
    int num)
{
    const char *p;
    char *rv;
    int namepfx, anmnamepfx, n;

    /* split path from extension ("dir/file.png" -> "dir/file", ".png") */
    p = util_shortname(name);
    if (!(p = strrchr(p, '.')))
        p = name + strlen(name);
    namepfx = p - name;

    /* get basename of the anm file ("dir/file.anm" -> "file") */
    anmname = util_shortname(anmname);
    if (!(p = strrchr(anmname, '.')))
        p = anmname + strlen(anmname);
    anmnamepfx = p - anmname;

    n = snprintf(0, 0, "%.*s@%.*s@%d%s", namepfx, name, anmnamepfx, anmname, num, name+namepfx);
    if (n == -1)
        abort();
    rv = malloc(n+1);
    if (!rv)
        abort();
    snprintf(rv, n+1, "%.*s@%.*s@%d%s", namepfx, name, anmnamepfx, anmname, num, name+namepfx);
    return rv;
}